

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O1

void write_frame_header(j_compress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  JPEG_MARKER code;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  iVar3 = cinfo->num_components;
  if (iVar3 < 1) {
    bVar7 = false;
  }
  else {
    piVar4 = &cinfo->comp_info->quant_tbl_no;
    iVar6 = 0;
    iVar5 = 0;
    do {
      iVar3 = emit_dqt(cinfo,*piVar4);
      iVar6 = iVar6 + iVar3;
      iVar5 = iVar5 + 1;
      iVar3 = cinfo->num_components;
      piVar4 = piVar4 + 0x18;
    } while (iVar5 < iVar3);
    bVar7 = iVar6 != 0;
  }
  bVar2 = false;
  if (((cinfo->arith_code == 0) && (bVar2 = false, cinfo->progressive_mode == 0)) &&
     (cinfo->data_precision == 8)) {
    if (iVar3 < 1) {
      bVar2 = true;
    }
    else {
      piVar4 = &cinfo->comp_info->ac_tbl_no;
      bVar2 = true;
      do {
        if ((1 < piVar4[-1]) || (1 < *piVar4)) {
          bVar2 = false;
        }
        piVar4 = piVar4 + 0x18;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    if ((bool)(bVar7 & bVar2)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x4b;
      bVar2 = false;
      (*pjVar1->emit_message)((j_common_ptr)cinfo,0);
    }
  }
  if (cinfo->arith_code == 0) {
    code = M_SOF2;
    if (cinfo->progressive_mode == 0) {
      code = !bVar2 + M_SOF0;
    }
  }
  else {
    code = M_SOF10 - (cinfo->progressive_mode == 0);
  }
  emit_sof(cinfo,code);
  return;
}

Assistant:

METHODDEF(void)
write_frame_header(j_compress_ptr cinfo)
{
  int ci, prec;
  boolean is_baseline;
  jpeg_component_info *compptr;

  /* Emit DQT for each quantization table.
   * Note that emit_dqt() suppresses any duplicate tables.
   */
  prec = 0;
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    prec += emit_dqt(cinfo, compptr->quant_tbl_no);
  }
  /* now prec is nonzero iff there are any 16-bit quant tables. */

  /* Check for a non-baseline specification.
   * Note we assume that Huffman table numbers won't be changed later.
   */
  if (cinfo->arith_code || cinfo->progressive_mode ||
      cinfo->data_precision != 8) {
    is_baseline = FALSE;
  } else {
    is_baseline = TRUE;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      if (compptr->dc_tbl_no > 1 || compptr->ac_tbl_no > 1)
        is_baseline = FALSE;
    }
    if (prec && is_baseline) {
      is_baseline = FALSE;
      /* If it's baseline except for quantizer size, warn the user */
      TRACEMS(cinfo, 0, JTRC_16BIT_TABLES);
    }
  }

  /* Emit the proper SOF marker */
  if (cinfo->arith_code) {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF10); /* SOF code for progressive arithmetic */
    else
      emit_sof(cinfo, M_SOF9);  /* SOF code for sequential arithmetic */
  } else {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF2);  /* SOF code for progressive Huffman */
    else if (is_baseline)
      emit_sof(cinfo, M_SOF0);  /* SOF code for baseline implementation */
    else
      emit_sof(cinfo, M_SOF1);  /* SOF code for non-baseline Huffman file */
  }
}